

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack8to4_int8.h
# Opt level: O2

void ncnn::im2col_sgemm_pack8to4_int8_sse(Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Option *opt)

{
  undefined1 auVar1 [16];
  uint uVar2;
  uint uVar3;
  void *pvVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  uint _c;
  int *piVar19;
  int iVar20;
  undefined8 *puVar21;
  ulong uVar22;
  uint uVar23;
  ulong uVar24;
  long lVar25;
  ulong uVar26;
  long lVar27;
  undefined1 (*pauVar28) [16];
  long lVar29;
  int q;
  ulong uVar30;
  long lVar31;
  undefined1 (*pauVar32) [16];
  undefined8 *puVar33;
  int iVar34;
  ulong uVar35;
  int iVar36;
  bool bVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [64];
  undefined1 auVar40 [16];
  undefined1 auVar41 [64];
  undefined1 auVar42 [16];
  undefined1 auVar43 [64];
  undefined1 auVar44 [16];
  undefined1 auVar45 [64];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [64];
  size_t local_d8;
  undefined1 local_c8 [16];
  Mat *local_b0;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  iVar20 = cpu_support_x86_avx2();
  if (iVar20 != 0) {
    im2col_sgemm_pack8to4_int8_sse_avx2(bottom_im2col,top_blob,kernel,opt);
    return;
  }
  iVar20 = cpu_support_x86_xop();
  if (iVar20 == 0) {
    uVar2 = bottom_im2col->w;
    lVar25 = (long)(int)uVar2;
    iVar20 = bottom_im2col->h;
    uVar23 = bottom_im2col->c;
    uVar3 = top_blob->c;
    local_d8 = 0;
    local_118._16_8_ = 0;
    local_118._24_4_ = 0;
    local_118._0_8_ = (void *)0x0;
    local_118._8_4_ = 0;
    local_118._12_4_ = 0;
    local_118._48_12_ = SUB1612((undefined1  [16])0x0,4);
    local_118._32_8_ = (Allocator *)0x0;
    local_118._40_4_ = 0;
    local_118._44_4_ = 0;
    _c = (uVar2 & 1) + (uVar2 >> 1);
    if (lVar25 < 2) {
      _c = uVar2;
    }
    local_b0 = top_blob;
    Mat::create((Mat *)local_118,iVar20 << (1 < lVar25),uVar23,_c,8,8,opt->workspace_allocator);
    uVar22 = 0;
    iVar36 = 0;
    if (0 < iVar20) {
      iVar36 = iVar20;
    }
    uVar26 = 0;
    if (0 < (int)uVar23) {
      uVar26 = (ulong)uVar23;
    }
    uVar35 = (ulong)(uint)((int)uVar2 >> 1);
    if ((int)uVar2 >> 1 < 1) {
      uVar35 = uVar22;
    }
    for (uVar24 = 0; uVar24 != uVar35; uVar24 = uVar24 + 1) {
      pauVar28 = (undefined1 (*) [16])(local_d8 * uVar24 * local_118._16_8_ + local_118._0_8_);
      for (uVar30 = 0; uVar30 != uVar26; uVar30 = uVar30 + 1) {
        pauVar32 = (undefined1 (*) [16])
                   ((long)bottom_im2col->data +
                   bottom_im2col->cstep * bottom_im2col->elemsize * uVar30 + uVar22);
        iVar34 = iVar36;
        while (bVar37 = iVar34 != 0, iVar34 = iVar34 + -1, bVar37) {
          *pauVar28 = *pauVar32;
          pauVar28 = pauVar28 + 1;
          pauVar32 = (undefined1 (*) [16])(*pauVar32 + lVar25 * 8);
        }
      }
      uVar22 = uVar22 + 0x10;
    }
    uVar22 = (ulong)(int)(uVar2 & 0xfffffffe);
    lVar31 = uVar22 * 8;
    for (; (long)uVar22 < lVar25; uVar22 = uVar22 + 1) {
      uVar35 = (ulong)(uint)((int)uVar22 >> 0x1f) << 0x20 | uVar22 & 0xffffffff;
      puVar21 = (undefined8 *)
                ((long)((int)((long)uVar35 % 2) + (int)((long)uVar35 / 2)) * local_d8 *
                 local_118._16_8_ + local_118._0_8_);
      pvVar4 = bottom_im2col->data;
      for (uVar35 = 0; uVar35 != uVar26; uVar35 = uVar35 + 1) {
        puVar33 = (undefined8 *)
                  ((long)pvVar4 + bottom_im2col->cstep * bottom_im2col->elemsize * uVar35 + lVar31);
        iVar34 = iVar36;
        while (bVar37 = iVar34 != 0, iVar34 = iVar34 + -1, bVar37) {
          *puVar21 = *puVar33;
          puVar21 = puVar21 + 1;
          puVar33 = puVar33 + lVar25;
        }
      }
      lVar31 = lVar31 + 8;
    }
    uVar26 = 0;
    uVar22 = (ulong)(uVar23 * iVar20);
    if ((int)(uVar23 * iVar20) < 1) {
      uVar22 = uVar26;
    }
    uVar35 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar35 = uVar26;
    }
    for (; uVar26 != uVar35; uVar26 = uVar26 + 1) {
      pauVar28 = (undefined1 (*) [16])
                 (local_b0->cstep * uVar26 * local_b0->elemsize + (long)local_b0->data);
      lVar31 = 0;
      for (uVar24 = 0; (long)(uVar24 | 1) < lVar25; uVar24 = uVar24 + 2) {
        lVar27 = kernel->cstep * uVar26 * kernel->elemsize;
        local_c8 = (undefined1  [16])0x0;
        lVar29 = 0;
        local_128 = (undefined1  [16])0x0;
        auVar41 = ZEXT1664((undefined1  [16])0x0);
        auVar43 = ZEXT1664((undefined1  [16])0x0);
        auVar39 = ZEXT1664((undefined1  [16])0x0);
        auVar45 = ZEXT1664((undefined1  [16])0x0);
        local_138 = (undefined1  [16])0x0;
        local_148 = (undefined1  [16])0x0;
        uVar30 = uVar22;
        while( true ) {
          iVar20 = (int)uVar30;
          uVar30 = (ulong)(iVar20 - 1);
          auVar38 = auVar39._0_16_;
          auVar44 = auVar45._0_16_;
          auVar40 = auVar41._0_16_;
          auVar42 = auVar43._0_16_;
          if (iVar20 == 0) break;
          auVar1 = *(undefined1 (*) [16])
                    (local_118._0_8_ + lVar29 + local_d8 * local_118._16_8_ * lVar31);
          auVar5 = vpcmpgtb_avx((undefined1  [16])0x0,auVar1);
          auVar17 = vpunpcklbw_avx(auVar1,auVar5);
          auVar16 = vpunpckhbw_avx(auVar1,auVar5);
          auVar1 = *(undefined1 (*) [16])((long)kernel->data + lVar29 * 2 + lVar27);
          auVar5 = *(undefined1 (*) [16])((long)kernel->data + lVar29 * 2 + lVar27 + 0x10);
          auVar6 = vpcmpgtb_avx((undefined1  [16])0x0,auVar1);
          auVar7 = vpcmpgtb_avx((undefined1  [16])0x0,auVar5);
          auVar18 = vpunpcklbw_avx(auVar1,auVar6);
          auVar1 = vpunpckhbw_avx(auVar1,auVar6);
          auVar6 = vpunpcklbw_avx(auVar5,auVar7);
          auVar5 = vpunpckhbw_avx(auVar5,auVar7);
          auVar12 = vpmullw_avx(auVar18,auVar17);
          auVar7 = vpmulhw_avx(auVar17,auVar18);
          auVar13 = vpmullw_avx(auVar1,auVar17);
          auVar8 = vpmulhw_avx(auVar17,auVar1);
          auVar14 = vpmullw_avx(auVar6,auVar17);
          auVar9 = vpmulhw_avx(auVar17,auVar6);
          auVar15 = vpmullw_avx(auVar5,auVar17);
          auVar17 = vpmulhw_avx(auVar17,auVar5);
          local_58 = vpmullw_avx(auVar18,auVar16);
          auVar18 = vpmulhw_avx(auVar16,auVar18);
          local_68 = vpmullw_avx(auVar1,auVar16);
          auVar10 = vpmulhw_avx(auVar16,auVar1);
          local_78 = vpmullw_avx(auVar6,auVar16);
          auVar11 = vpmulhw_avx(auVar16,auVar6);
          local_88 = vpmullw_avx(auVar5,auVar16);
          auVar16 = vpmulhw_avx(auVar16,auVar5);
          auVar1 = vpunpcklwd_avx(auVar12,auVar7);
          auVar1 = vpaddd_avx(auVar1,local_148);
          auVar5 = vpunpcklwd_avx(auVar13,auVar8);
          auVar5 = vpaddd_avx(auVar5,local_138);
          auVar6 = vpunpcklwd_avx(auVar14,auVar9);
          auVar44 = vpaddd_avx(auVar44,auVar6);
          auVar6 = vpunpcklwd_avx(auVar15,auVar17);
          auVar6 = vpaddd_avx(auVar6,auVar38);
          auVar7 = vpunpckhwd_avx(auVar12,auVar7);
          local_148 = vpaddd_avx(auVar1,auVar7);
          auVar1 = vpunpckhwd_avx(auVar13,auVar8);
          local_138 = vpaddd_avx(auVar5,auVar1);
          auVar1 = vpunpckhwd_avx(auVar14,auVar9);
          auVar44 = vpaddd_avx(auVar44,auVar1);
          auVar45 = ZEXT1664(auVar44);
          auVar44 = vpunpckhwd_avx(auVar15,auVar17);
          auVar44 = vpaddd_avx(auVar6,auVar44);
          auVar39 = ZEXT1664(auVar44);
          auVar44 = vpunpcklwd_avx(local_58,auVar18);
          auVar44 = vpaddd_avx(auVar44,auVar42);
          auVar1 = vpunpcklwd_avx(local_68,auVar10);
          auVar1 = vpaddd_avx(auVar1,auVar40);
          auVar5 = vpunpcklwd_avx(local_78,auVar11);
          auVar5 = vpaddd_avx(auVar5,local_128);
          auVar6 = vpunpcklwd_avx(local_88,auVar16);
          auVar6 = vpaddd_avx(auVar6,local_c8);
          auVar7 = vpunpckhwd_avx(local_58,auVar18);
          auVar44 = vpaddd_avx(auVar44,auVar7);
          auVar43 = ZEXT1664(auVar44);
          auVar44 = vpunpckhwd_avx(local_68,auVar10);
          auVar44 = vpaddd_avx(auVar1,auVar44);
          auVar41 = ZEXT1664(auVar44);
          auVar44 = vpunpckhwd_avx(local_78,auVar11);
          local_128 = vpaddd_avx(auVar5,auVar44);
          auVar44 = vpunpckhwd_avx(local_88,auVar16);
          local_c8 = vpaddd_avx(auVar6,auVar44);
          lVar29 = lVar29 + 0x10;
          local_a8 = auVar38;
          local_98 = auVar40;
          local_48 = auVar42;
        }
        auVar6 = vpunpckldq_avx(local_148,local_138);
        auVar7 = vpunpckldq_avx(auVar44,auVar38);
        auVar1 = vpunpckhdq_avx(local_148,local_138);
        auVar44 = vpunpckhdq_avx(auVar44,auVar38);
        auVar8 = vpunpckldq_avx(auVar42,auVar40);
        auVar9 = vpunpckldq_avx(local_128,local_c8);
        auVar42 = vpunpckhdq_avx(auVar42,auVar40);
        auVar5 = vpunpckhdq_avx(local_128,local_c8);
        auVar40 = vpunpcklqdq_avx(auVar6,auVar7);
        auVar38 = vpunpckhqdq_avx(auVar6,auVar7);
        auVar38 = vpaddd_avx(auVar40,auVar38);
        auVar6 = vpunpcklqdq_avx(auVar1,auVar44);
        auVar40 = vpunpckhqdq_avx(auVar1,auVar44);
        auVar40 = vpaddd_avx(auVar40,auVar6);
        auVar38 = vpaddd_avx(auVar38,auVar40);
        auVar44 = vpunpcklqdq_avx(auVar8,auVar9);
        auVar40 = vpunpckhqdq_avx(auVar8,auVar9);
        auVar40 = vpaddd_avx(auVar44,auVar40);
        auVar44 = vpunpcklqdq_avx(auVar42,auVar5);
        auVar42 = vpunpckhqdq_avx(auVar42,auVar5);
        auVar42 = vpaddd_avx(auVar42,auVar44);
        auVar40 = vpaddd_avx(auVar40,auVar42);
        *pauVar28 = auVar38;
        pauVar28[1] = auVar40;
        pauVar28 = pauVar28 + 2;
        lVar31 = lVar31 + 1;
      }
      while (uVar23 = (uint)uVar24, (int)uVar23 < (int)uVar2) {
        pauVar32 = (undefined1 (*) [16])
                   (kernel->cstep * uVar26 * kernel->elemsize + (long)kernel->data);
        auVar39 = ZEXT1664((undefined1  [16])0x0);
        lVar31 = 0;
        auVar41 = ZEXT1664((undefined1  [16])0x0);
        auVar43 = ZEXT1664((undefined1  [16])0x0);
        auVar45 = ZEXT1664((undefined1  [16])0x0);
        while( true ) {
          auVar38 = auVar39._0_16_;
          auVar40 = auVar41._0_16_;
          auVar42 = auVar43._0_16_;
          auVar44 = auVar45._0_16_;
          if ((int)uVar22 == (int)lVar31) break;
          auVar1._8_8_ = 0;
          auVar1._0_8_ = *(ulong *)(local_118._0_8_ +
                                   lVar31 * 8 +
                                   local_d8 * local_118._16_8_ *
                                   (ulong)((uVar23 & 1) + ((uint)(uVar24 >> 1) & 0x7fffffff)));
          auVar8 = vpmovsxbw_avx(auVar1);
          auVar1 = *pauVar32;
          auVar5 = pauVar32[1];
          auVar6 = vpcmpgtb_avx((undefined1  [16])0x0,auVar1);
          auVar7 = vpcmpgtb_avx((undefined1  [16])0x0,auVar5);
          auVar17 = vpunpcklbw_avx(auVar1,auVar6);
          auVar6 = vpunpckhbw_avx(auVar1,auVar6);
          auVar10 = vpunpcklbw_avx(auVar5,auVar7);
          auVar7 = vpunpckhbw_avx(auVar5,auVar7);
          auVar9 = vpmullw_avx(auVar17,auVar8);
          auVar1 = vpmulhw_avx(auVar17,auVar8);
          auVar17 = vpmullw_avx(auVar6,auVar8);
          auVar5 = vpmulhw_avx(auVar8,auVar6);
          auVar18 = vpmullw_avx(auVar10,auVar8);
          auVar6 = vpmulhw_avx(auVar8,auVar10);
          auVar10 = vpmullw_avx(auVar7,auVar8);
          auVar7 = vpmulhw_avx(auVar8,auVar7);
          auVar8 = vpunpcklwd_avx(auVar9,auVar1);
          auVar38 = vpaddd_avx(auVar38,auVar8);
          auVar8 = vpunpcklwd_avx(auVar17,auVar5);
          auVar40 = vpaddd_avx(auVar40,auVar8);
          auVar8 = vpunpcklwd_avx(auVar18,auVar6);
          auVar42 = vpaddd_avx(auVar42,auVar8);
          auVar8 = vpunpcklwd_avx(auVar10,auVar7);
          auVar44 = vpaddd_avx(auVar44,auVar8);
          auVar1 = vpunpckhwd_avx(auVar9,auVar1);
          auVar38 = vpaddd_avx(auVar38,auVar1);
          auVar39 = ZEXT1664(auVar38);
          auVar38 = vpunpckhwd_avx(auVar17,auVar5);
          auVar38 = vpaddd_avx(auVar40,auVar38);
          auVar41 = ZEXT1664(auVar38);
          auVar38 = vpunpckhwd_avx(auVar18,auVar6);
          auVar38 = vpaddd_avx(auVar42,auVar38);
          auVar43 = ZEXT1664(auVar38);
          auVar38 = vpunpckhwd_avx(auVar10,auVar7);
          auVar38 = vpaddd_avx(auVar44,auVar38);
          auVar45 = ZEXT1664(auVar38);
          pauVar32 = pauVar32 + 2;
          lVar31 = lVar31 + 1;
        }
        auVar1 = vpunpckldq_avx(auVar38,auVar40);
        auVar5 = vpunpckldq_avx(auVar42,auVar44);
        auVar40 = vpunpckhdq_avx(auVar38,auVar40);
        auVar42 = vpunpckhdq_avx(auVar42,auVar44);
        auVar44 = vpunpcklqdq_avx(auVar1,auVar5);
        auVar38 = vpunpckhqdq_avx(auVar1,auVar5);
        auVar38 = vpaddd_avx(auVar44,auVar38);
        auVar44 = vpunpcklqdq_avx(auVar40,auVar42);
        auVar40 = vpunpckhqdq_avx(auVar40,auVar42);
        auVar40 = vpaddd_avx(auVar40,auVar44);
        auVar38 = vpaddd_avx(auVar38,auVar40);
        *pauVar28 = auVar38;
        pauVar28 = pauVar28 + 1;
        uVar24 = (ulong)(uVar23 + 1);
      }
    }
    piVar19 = (int *)CONCAT44(local_118._12_4_,local_118._8_4_);
    if (piVar19 != (int *)0x0) {
      LOCK();
      *piVar19 = *piVar19 + -1;
      UNLOCK();
      if (*piVar19 == 0) {
        if ((Allocator *)local_118._32_8_ == (Allocator *)0x0) {
          free((void *)local_118._0_8_);
        }
        else {
          (*(*(_func_int ***)local_118._32_8_)[3])();
        }
      }
    }
    return;
  }
  im2col_sgemm_pack8to4_int8_sse_xop(bottom_im2col,top_blob,kernel,opt);
  return;
}

Assistant:

static void im2col_sgemm_pack8to4_int8_sse(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Option& opt)
{
#if !(__AVX512VNNI__ || __AVXVNNI__ || __AVX2__ || __XOP__)
#if NCNN_RUNTIME_CPU && NCNN_AVX512VNNI && __AVX512F__ && !__AVX512VNNI__
    if (ncnn::cpu_support_x86_avx512_vnni())
    {
        im2col_sgemm_pack8to4_int8_sse_avx512vnni(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVXVNNI && __AVX2__ && !__AVXVNNI__
    if (ncnn::cpu_support_x86_avx_vnni())
    {
        im2col_sgemm_pack8to4_int8_sse_avxvnni(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVX2 && __AVX__ && !__AVX2__
    if (ncnn::cpu_support_x86_avx2())
    {
        im2col_sgemm_pack8to4_int8_sse_avx2(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_XOP && __SSE2__ && !__XOP__
    if (ncnn::cpu_support_x86_xop())
    {
        im2col_sgemm_pack8to4_int8_sse_xop(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif
#endif

    // Mat bottom_im2col(size, maxk, inch, 8u, 8, opt.workspace_allocator);

    const int size = bottom_im2col.w;
    const int maxk = bottom_im2col.h;
    const int inch = bottom_im2col.c;

    const int outch = top_blob.c;

    // permute
    Mat tmp;
#if __AVX2__
    if (size >= 4)
        tmp.create(4 * maxk, inch, size / 4 + (size % 4) / 2 + size % 2, 8u, 8, opt.workspace_allocator);
    else if (size >= 2)
        tmp.create(2 * maxk, inch, size / 2 + size % 2, 8u, 8, opt.workspace_allocator);
    else
        tmp.create(maxk, inch, size, 8u, 8, opt.workspace_allocator);
#else
    if (size >= 2)
        tmp.create(2 * maxk, inch, size / 2 + size % 2, 8u, 8, opt.workspace_allocator);
    else
        tmp.create(maxk, inch, size, 8u, 8, opt.workspace_allocator);
#endif
    {
#if __AVX2__
        int remain_size_start = 0;
        int nn_size = size >> 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 4;

            int64_t* tmpptr = tmp.channel(i / 4);

            for (int q = 0; q < inch; q++)
            {
                const int64_t* img0 = (const int64_t*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    __m256i _v = _mm256_loadu_si256((const __m256i*)img0);
                    _mm256_storeu_si256((__m256i*)tmpptr, _v);
                    tmpptr += 4;
                    img0 += size;
                }
            }
        }

        remain_size_start += nn_size << 2;
        nn_size = (size - remain_size_start) >> 1;
#else
        int remain_size_start = 0;
        int nn_size = size >> 1;
#endif

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 2;

#if __AVX2__
            int64_t* tmpptr = tmp.channel(i / 4 + (i % 4) / 2);
#else
            int64_t* tmpptr = tmp.channel(i / 2);
#endif

            for (int q = 0; q < inch; q++)
            {
                const int64_t* img0 = (const int64_t*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    __m128i _v = _mm_loadu_si128((const __m128i*)img0);
                    _mm_storeu_si128((__m128i*)tmpptr, _v);
                    tmpptr += 2;
                    img0 += size;
                }
            }
        }

        remain_size_start += nn_size << 1;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = remain_size_start; i < size; i++)
        {
#if __AVX2__
            int64_t* tmpptr = tmp.channel(i / 4 + (i % 4) / 2 + i % 2);
#else
            int64_t* tmpptr = tmp.channel(i / 2 + i % 2);
#endif

            for (int q = 0; q < inch; q++)
            {
                const int64_t* img0 = (const int64_t*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    tmpptr += 1;
                    img0 += size;
                }
            }
        }
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        int* outptr0 = top_blob.channel(p);

        int i = 0;
#if __AVX2__
        for (; i + 3 < size; i += 4)
        {
            const signed char* tmpptr = tmp.channel(i / 4);
            const signed char* kptr0 = kernel.channel(p);

            int nn = inch * maxk; // inch always > 0

            __m256i _sum00_11 = _mm256_setzero_si256();
            __m256i _sum10_01 = _mm256_setzero_si256();
            __m256i _sum02_13 = _mm256_setzero_si256();
            __m256i _sum12_03 = _mm256_setzero_si256();

            __m256i _sum04_15 = _mm256_setzero_si256();
            __m256i _sum14_05 = _mm256_setzero_si256();
            __m256i _sum06_17 = _mm256_setzero_si256();
            __m256i _sum16_07 = _mm256_setzero_si256();

            int j = 0;
            for (; j < nn; j++)
            {
                __m128i _val01 = _mm_loadu_si128((const __m128i*)tmpptr);
                __m256i _val01_16 = _mm256_cvtepi8_epi16(_val01);

                __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                __m128i _w23 = _mm_loadu_si128((const __m128i*)(kptr0 + 16));
                __m256i _w01_16 = _mm256_cvtepi8_epi16(_w01);
                __m256i _w23_16 = _mm256_cvtepi8_epi16(_w23);

                __m256i _val10_16 = _mm256_permute4x64_epi64(_val01_16, 78);

#if __AVXVNNI__ || __AVX512VNNI__
                _sum00_11 = _mm256_dpwssd_epi32(_sum00_11, _val01_16, _w01_16);
                _sum10_01 = _mm256_dpwssd_epi32(_sum10_01, _val10_16, _w01_16);
                _sum02_13 = _mm256_dpwssd_epi32(_sum02_13, _val01_16, _w23_16);
                _sum12_03 = _mm256_dpwssd_epi32(_sum12_03, _val10_16, _w23_16);
#else
                __m256i _sl00_11 = _mm256_mullo_epi16(_val01_16, _w01_16);
                __m256i _sh00_11 = _mm256_mulhi_epi16(_val01_16, _w01_16);
                __m256i _sl10_01 = _mm256_mullo_epi16(_val10_16, _w01_16);
                __m256i _sh10_01 = _mm256_mulhi_epi16(_val10_16, _w01_16);
                __m256i _sl02_13 = _mm256_mullo_epi16(_val01_16, _w23_16);
                __m256i _sh02_13 = _mm256_mulhi_epi16(_val01_16, _w23_16);
                __m256i _sl12_03 = _mm256_mullo_epi16(_val10_16, _w23_16);
                __m256i _sh12_03 = _mm256_mulhi_epi16(_val10_16, _w23_16);

                _sum00_11 = _mm256_add_epi32(_sum00_11, _mm256_unpacklo_epi16(_sl00_11, _sh00_11));
                _sum10_01 = _mm256_add_epi32(_sum10_01, _mm256_unpacklo_epi16(_sl10_01, _sh10_01));
                _sum02_13 = _mm256_add_epi32(_sum02_13, _mm256_unpacklo_epi16(_sl02_13, _sh02_13));
                _sum12_03 = _mm256_add_epi32(_sum12_03, _mm256_unpacklo_epi16(_sl12_03, _sh12_03));
                _sum00_11 = _mm256_add_epi32(_sum00_11, _mm256_unpackhi_epi16(_sl00_11, _sh00_11));
                _sum10_01 = _mm256_add_epi32(_sum10_01, _mm256_unpackhi_epi16(_sl10_01, _sh10_01));
                _sum02_13 = _mm256_add_epi32(_sum02_13, _mm256_unpackhi_epi16(_sl02_13, _sh02_13));
                _sum12_03 = _mm256_add_epi32(_sum12_03, _mm256_unpackhi_epi16(_sl12_03, _sh12_03));
#endif

                __m128i _val23 = _mm_loadu_si128((const __m128i*)(tmpptr + 16));
                __m256i _val23_16 = _mm256_cvtepi8_epi16(_val23);
                __m256i _val32_16 = _mm256_permute4x64_epi64(_val23_16, 78);

#if __AVXVNNI__ || __AVX512VNNI__
                _sum04_15 = _mm256_dpwssd_epi32(_sum04_15, _val23_16, _w01_16);
                _sum14_05 = _mm256_dpwssd_epi32(_sum14_05, _val32_16, _w01_16);
                _sum06_17 = _mm256_dpwssd_epi32(_sum06_17, _val23_16, _w23_16);
                _sum16_07 = _mm256_dpwssd_epi32(_sum16_07, _val32_16, _w23_16);
#else
                __m256i _sl04_15 = _mm256_mullo_epi16(_val23_16, _w01_16);
                __m256i _sh04_15 = _mm256_mulhi_epi16(_val23_16, _w01_16);
                __m256i _sl14_05 = _mm256_mullo_epi16(_val32_16, _w01_16);
                __m256i _sh14_05 = _mm256_mulhi_epi16(_val32_16, _w01_16);
                __m256i _sl06_17 = _mm256_mullo_epi16(_val23_16, _w23_16);
                __m256i _sh06_17 = _mm256_mulhi_epi16(_val23_16, _w23_16);
                __m256i _sl16_07 = _mm256_mullo_epi16(_val32_16, _w23_16);
                __m256i _sh16_07 = _mm256_mulhi_epi16(_val32_16, _w23_16);

                _sum04_15 = _mm256_add_epi32(_sum04_15, _mm256_unpacklo_epi16(_sl04_15, _sh04_15));
                _sum14_05 = _mm256_add_epi32(_sum14_05, _mm256_unpacklo_epi16(_sl14_05, _sh14_05));
                _sum06_17 = _mm256_add_epi32(_sum06_17, _mm256_unpacklo_epi16(_sl06_17, _sh06_17));
                _sum16_07 = _mm256_add_epi32(_sum16_07, _mm256_unpacklo_epi16(_sl16_07, _sh16_07));
                _sum04_15 = _mm256_add_epi32(_sum04_15, _mm256_unpackhi_epi16(_sl04_15, _sh04_15));
                _sum14_05 = _mm256_add_epi32(_sum14_05, _mm256_unpackhi_epi16(_sl14_05, _sh14_05));
                _sum06_17 = _mm256_add_epi32(_sum06_17, _mm256_unpackhi_epi16(_sl06_17, _sh06_17));
                _sum16_07 = _mm256_add_epi32(_sum16_07, _mm256_unpackhi_epi16(_sl16_07, _sh16_07));
#endif

                tmpptr += 32;
                kptr0 += 32;
            }

            // transpose 4x8
            {
                __m256i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm256_unpacklo_epi32(_sum00_11, _sum10_01);
                _tmp1 = _mm256_unpacklo_epi32(_sum02_13, _sum12_03);
                _tmp2 = _mm256_unpackhi_epi32(_sum00_11, _sum10_01);
                _tmp3 = _mm256_unpackhi_epi32(_sum02_13, _sum12_03);
                _sum00_11 = _mm256_unpacklo_epi64(_tmp0, _tmp1);
                _sum10_01 = _mm256_unpackhi_epi64(_tmp0, _tmp1);
                _sum02_13 = _mm256_unpacklo_epi64(_tmp2, _tmp3);
                _sum12_03 = _mm256_unpackhi_epi64(_tmp2, _tmp3);
            }
            {
                __m256i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm256_unpacklo_epi32(_sum04_15, _sum14_05);
                _tmp1 = _mm256_unpacklo_epi32(_sum06_17, _sum16_07);
                _tmp2 = _mm256_unpackhi_epi32(_sum04_15, _sum14_05);
                _tmp3 = _mm256_unpackhi_epi32(_sum06_17, _sum16_07);
                _sum04_15 = _mm256_unpacklo_epi64(_tmp0, _tmp1);
                _sum14_05 = _mm256_unpackhi_epi64(_tmp0, _tmp1);
                _sum06_17 = _mm256_unpacklo_epi64(_tmp2, _tmp3);
                _sum16_07 = _mm256_unpackhi_epi64(_tmp2, _tmp3);
            }

            _sum00_11 = _mm256_add_epi32(_sum00_11, _sum10_01);
            _sum02_13 = _mm256_add_epi32(_sum02_13, _sum12_03);
            _sum00_11 = _mm256_add_epi32(_sum00_11, _sum02_13);

            _sum04_15 = _mm256_add_epi32(_sum04_15, _sum14_05);
            _sum06_17 = _mm256_add_epi32(_sum06_17, _sum16_07);
            _sum04_15 = _mm256_add_epi32(_sum04_15, _sum06_17);

            __m256i _perm_mask = _mm256_set_epi32(6, 3, 4, 1, 7, 2, 5, 0);
            _sum00_11 = _mm256_permutevar8x32_epi32(_sum00_11, _perm_mask);
            _sum04_15 = _mm256_permutevar8x32_epi32(_sum04_15, _perm_mask);

            _mm256_storeu_si256((__m256i*)outptr0, _sum00_11);
            _mm256_storeu_si256((__m256i*)(outptr0 + 8), _sum04_15);
            outptr0 += 16;
        }
#endif
        for (; i + 1 < size; i += 2)
        {
#if __AVX2__
            const signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2);
#else
            const signed char* tmpptr = tmp.channel(i / 2);
#endif
            const signed char* kptr0 = kernel.channel(p);

            int nn = inch * maxk; // inch always > 0

#if __AVX2__
            __m256i _sum00_11 = _mm256_setzero_si256();
            __m256i _sum10_01 = _mm256_setzero_si256();
            __m256i _sum02_13 = _mm256_setzero_si256();
            __m256i _sum12_03 = _mm256_setzero_si256();
#else
            __m128i _sum00 = _mm_setzero_si128();
            __m128i _sum01 = _mm_setzero_si128();
            __m128i _sum02 = _mm_setzero_si128();
            __m128i _sum03 = _mm_setzero_si128();
            __m128i _sum10 = _mm_setzero_si128();
            __m128i _sum11 = _mm_setzero_si128();
            __m128i _sum12 = _mm_setzero_si128();
            __m128i _sum13 = _mm_setzero_si128();
#endif

            int j = 0;
            for (; j < nn; j++)
            {
#if __AVX2__
                __m128i _val01 = _mm_loadu_si128((const __m128i*)tmpptr);
                __m256i _val01_16 = _mm256_cvtepi8_epi16(_val01);

                __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                __m128i _w23 = _mm_loadu_si128((const __m128i*)(kptr0 + 16));
                __m256i _w01_16 = _mm256_cvtepi8_epi16(_w01);
                __m256i _w23_16 = _mm256_cvtepi8_epi16(_w23);

                __m256i _val10_16 = _mm256_permute4x64_epi64(_val01_16, 78);

#if __AVXVNNI__ || __AVX512VNNI__
                _sum00_11 = _mm256_dpwssd_epi32(_sum00_11, _val01_16, _w01_16);
                _sum10_01 = _mm256_dpwssd_epi32(_sum10_01, _val10_16, _w01_16);
                _sum02_13 = _mm256_dpwssd_epi32(_sum02_13, _val01_16, _w23_16);
                _sum12_03 = _mm256_dpwssd_epi32(_sum12_03, _val10_16, _w23_16);
#else
                __m256i _sl00_11 = _mm256_mullo_epi16(_val01_16, _w01_16);
                __m256i _sh00_11 = _mm256_mulhi_epi16(_val01_16, _w01_16);
                __m256i _sl10_01 = _mm256_mullo_epi16(_val10_16, _w01_16);
                __m256i _sh10_01 = _mm256_mulhi_epi16(_val10_16, _w01_16);
                __m256i _sl02_13 = _mm256_mullo_epi16(_val01_16, _w23_16);
                __m256i _sh02_13 = _mm256_mulhi_epi16(_val01_16, _w23_16);
                __m256i _sl12_03 = _mm256_mullo_epi16(_val10_16, _w23_16);
                __m256i _sh12_03 = _mm256_mulhi_epi16(_val10_16, _w23_16);

                _sum00_11 = _mm256_add_epi32(_sum00_11, _mm256_unpacklo_epi16(_sl00_11, _sh00_11));
                _sum10_01 = _mm256_add_epi32(_sum10_01, _mm256_unpacklo_epi16(_sl10_01, _sh10_01));
                _sum02_13 = _mm256_add_epi32(_sum02_13, _mm256_unpacklo_epi16(_sl02_13, _sh02_13));
                _sum12_03 = _mm256_add_epi32(_sum12_03, _mm256_unpacklo_epi16(_sl12_03, _sh12_03));
                _sum00_11 = _mm256_add_epi32(_sum00_11, _mm256_unpackhi_epi16(_sl00_11, _sh00_11));
                _sum10_01 = _mm256_add_epi32(_sum10_01, _mm256_unpackhi_epi16(_sl10_01, _sh10_01));
                _sum02_13 = _mm256_add_epi32(_sum02_13, _mm256_unpackhi_epi16(_sl02_13, _sh02_13));
                _sum12_03 = _mm256_add_epi32(_sum12_03, _mm256_unpackhi_epi16(_sl12_03, _sh12_03));
#endif
#else
                __m128i _val01 = _mm_loadu_si128((const __m128i*)tmpptr);
                __m128i _extval01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _val01);
                __m128i _val0 = _mm_unpacklo_epi8(_val01, _extval01);
                __m128i _val1 = _mm_unpackhi_epi8(_val01, _extval01);

                __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                __m128i _w23 = _mm_loadu_si128((const __m128i*)(kptr0 + 16));
                __m128i _extw01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w01);
                __m128i _extw23 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w23);
                __m128i _w0 = _mm_unpacklo_epi8(_w01, _extw01);
                __m128i _w1 = _mm_unpackhi_epi8(_w01, _extw01);
                __m128i _w2 = _mm_unpacklo_epi8(_w23, _extw23);
                __m128i _w3 = _mm_unpackhi_epi8(_w23, _extw23);

#if __XOP__
                _sum00 = _mm_maddd_epi16(_val0, _w0, _sum00);
                _sum01 = _mm_maddd_epi16(_val0, _w1, _sum01);
                _sum02 = _mm_maddd_epi16(_val0, _w2, _sum02);
                _sum03 = _mm_maddd_epi16(_val0, _w3, _sum03);
                _sum10 = _mm_maddd_epi16(_val1, _w0, _sum10);
                _sum11 = _mm_maddd_epi16(_val1, _w1, _sum11);
                _sum12 = _mm_maddd_epi16(_val1, _w2, _sum12);
                _sum13 = _mm_maddd_epi16(_val1, _w3, _sum13);
#else
                __m128i _sl00 = _mm_mullo_epi16(_val0, _w0);
                __m128i _sh00 = _mm_mulhi_epi16(_val0, _w0);
                __m128i _sl01 = _mm_mullo_epi16(_val0, _w1);
                __m128i _sh01 = _mm_mulhi_epi16(_val0, _w1);
                __m128i _sl02 = _mm_mullo_epi16(_val0, _w2);
                __m128i _sh02 = _mm_mulhi_epi16(_val0, _w2);
                __m128i _sl03 = _mm_mullo_epi16(_val0, _w3);
                __m128i _sh03 = _mm_mulhi_epi16(_val0, _w3);
                __m128i _sl10 = _mm_mullo_epi16(_val1, _w0);
                __m128i _sh10 = _mm_mulhi_epi16(_val1, _w0);
                __m128i _sl11 = _mm_mullo_epi16(_val1, _w1);
                __m128i _sh11 = _mm_mulhi_epi16(_val1, _w1);
                __m128i _sl12 = _mm_mullo_epi16(_val1, _w2);
                __m128i _sh12 = _mm_mulhi_epi16(_val1, _w2);
                __m128i _sl13 = _mm_mullo_epi16(_val1, _w3);
                __m128i _sh13 = _mm_mulhi_epi16(_val1, _w3);

                _sum00 = _mm_add_epi32(_sum00, _mm_unpacklo_epi16(_sl00, _sh00));
                _sum01 = _mm_add_epi32(_sum01, _mm_unpacklo_epi16(_sl01, _sh01));
                _sum02 = _mm_add_epi32(_sum02, _mm_unpacklo_epi16(_sl02, _sh02));
                _sum03 = _mm_add_epi32(_sum03, _mm_unpacklo_epi16(_sl03, _sh03));
                _sum00 = _mm_add_epi32(_sum00, _mm_unpackhi_epi16(_sl00, _sh00));
                _sum01 = _mm_add_epi32(_sum01, _mm_unpackhi_epi16(_sl01, _sh01));
                _sum02 = _mm_add_epi32(_sum02, _mm_unpackhi_epi16(_sl02, _sh02));
                _sum03 = _mm_add_epi32(_sum03, _mm_unpackhi_epi16(_sl03, _sh03));
                _sum10 = _mm_add_epi32(_sum10, _mm_unpacklo_epi16(_sl10, _sh10));
                _sum11 = _mm_add_epi32(_sum11, _mm_unpacklo_epi16(_sl11, _sh11));
                _sum12 = _mm_add_epi32(_sum12, _mm_unpacklo_epi16(_sl12, _sh12));
                _sum13 = _mm_add_epi32(_sum13, _mm_unpacklo_epi16(_sl13, _sh13));
                _sum10 = _mm_add_epi32(_sum10, _mm_unpackhi_epi16(_sl10, _sh10));
                _sum11 = _mm_add_epi32(_sum11, _mm_unpackhi_epi16(_sl11, _sh11));
                _sum12 = _mm_add_epi32(_sum12, _mm_unpackhi_epi16(_sl12, _sh12));
                _sum13 = _mm_add_epi32(_sum13, _mm_unpackhi_epi16(_sl13, _sh13));
#endif
#endif

                tmpptr += 16;
                kptr0 += 32;
            }

#if __AVX2__
            // transpose 4x8
            {
                __m256i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm256_unpacklo_epi32(_sum00_11, _sum10_01);
                _tmp1 = _mm256_unpacklo_epi32(_sum02_13, _sum12_03);
                _tmp2 = _mm256_unpackhi_epi32(_sum00_11, _sum10_01);
                _tmp3 = _mm256_unpackhi_epi32(_sum02_13, _sum12_03);
                _sum00_11 = _mm256_unpacklo_epi64(_tmp0, _tmp1);
                _sum10_01 = _mm256_unpackhi_epi64(_tmp0, _tmp1);
                _sum02_13 = _mm256_unpacklo_epi64(_tmp2, _tmp3);
                _sum12_03 = _mm256_unpackhi_epi64(_tmp2, _tmp3);
            }

            _sum00_11 = _mm256_add_epi32(_sum00_11, _sum10_01);
            _sum02_13 = _mm256_add_epi32(_sum02_13, _sum12_03);
            _sum00_11 = _mm256_add_epi32(_sum00_11, _sum02_13);

            __m256i _perm_mask = _mm256_set_epi32(6, 3, 4, 1, 7, 2, 5, 0);
            _sum00_11 = _mm256_permutevar8x32_epi32(_sum00_11, _perm_mask);

            _mm256_storeu_si256((__m256i*)outptr0, _sum00_11);
#else
            // transpose 4x4
            {
                __m128i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm_unpacklo_epi32(_sum00, _sum01);
                _tmp1 = _mm_unpacklo_epi32(_sum02, _sum03);
                _tmp2 = _mm_unpackhi_epi32(_sum00, _sum01);
                _tmp3 = _mm_unpackhi_epi32(_sum02, _sum03);
                _sum00 = _mm_unpacklo_epi64(_tmp0, _tmp1);
                _sum01 = _mm_unpackhi_epi64(_tmp0, _tmp1);
                _sum02 = _mm_unpacklo_epi64(_tmp2, _tmp3);
                _sum03 = _mm_unpackhi_epi64(_tmp2, _tmp3);
            }
            {
                __m128i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm_unpacklo_epi32(_sum10, _sum11);
                _tmp1 = _mm_unpacklo_epi32(_sum12, _sum13);
                _tmp2 = _mm_unpackhi_epi32(_sum10, _sum11);
                _tmp3 = _mm_unpackhi_epi32(_sum12, _sum13);
                _sum10 = _mm_unpacklo_epi64(_tmp0, _tmp1);
                _sum11 = _mm_unpackhi_epi64(_tmp0, _tmp1);
                _sum12 = _mm_unpacklo_epi64(_tmp2, _tmp3);
                _sum13 = _mm_unpackhi_epi64(_tmp2, _tmp3);
            }

            _sum00 = _mm_add_epi32(_sum00, _sum01);
            _sum02 = _mm_add_epi32(_sum02, _sum03);
            _sum10 = _mm_add_epi32(_sum10, _sum11);
            _sum12 = _mm_add_epi32(_sum12, _sum13);

            _sum00 = _mm_add_epi32(_sum00, _sum02);
            _sum10 = _mm_add_epi32(_sum10, _sum12);

            _mm_storeu_si128((__m128i*)outptr0, _sum00);
            _mm_storeu_si128((__m128i*)(outptr0 + 4), _sum10);
#endif
            outptr0 += 8;
        }
        for (; i < size; i++)
        {
#if __AVX2__
            const signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2 + i % 2);
#else
            const signed char* tmpptr = tmp.channel(i / 2 + i % 2);
#endif
            const signed char* kptr0 = kernel.channel(p);

            int nn = inch * maxk; // inch always > 0

#if __AVX2__
            __m256i _sum0_1 = _mm256_setzero_si256();
            __m256i _sum2_3 = _mm256_setzero_si256();
#else
            __m128i _sum0 = _mm_setzero_si128();
            __m128i _sum1 = _mm_setzero_si128();
            __m128i _sum2 = _mm_setzero_si128();
            __m128i _sum3 = _mm_setzero_si128();
#endif

            int j = 0;
            for (; j < nn; j++)
            {
#if __AVX2__
                __m128i _val = _mm_loadl_epi64((const __m128i*)tmpptr);
                _val = _mm_cvtepi8_epi16(_val);

                __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                __m128i _w23 = _mm_loadu_si128((const __m128i*)(kptr0 + 16));
                __m256i _w01_16 = _mm256_cvtepi8_epi16(_w01);
                __m256i _w23_16 = _mm256_cvtepi8_epi16(_w23);

                __m256i _valval = _mm256_inserti128_si256(_mm256_castsi128_si256(_val), _val, 1);

#if __AVXVNNI__ || __AVX512VNNI__
                _sum0_1 = _mm256_dpwssd_epi32(_sum0_1, _valval, _w01_16);
                _sum2_3 = _mm256_dpwssd_epi32(_sum2_3, _valval, _w23_16);
#else
                __m256i _sl0_1 = _mm256_mullo_epi16(_valval, _w01_16);
                __m256i _sh0_1 = _mm256_mulhi_epi16(_valval, _w01_16);
                __m256i _sl2_3 = _mm256_mullo_epi16(_valval, _w23_16);
                __m256i _sh2_3 = _mm256_mulhi_epi16(_valval, _w23_16);

                _sum0_1 = _mm256_add_epi32(_sum0_1, _mm256_unpacklo_epi16(_sl0_1, _sh0_1));
                _sum2_3 = _mm256_add_epi32(_sum2_3, _mm256_unpacklo_epi16(_sl2_3, _sh2_3));
                _sum0_1 = _mm256_add_epi32(_sum0_1, _mm256_unpackhi_epi16(_sl0_1, _sh0_1));
                _sum2_3 = _mm256_add_epi32(_sum2_3, _mm256_unpackhi_epi16(_sl2_3, _sh2_3));
#endif
#else
                __m128i _val = _mm_loadl_epi64((const __m128i*)tmpptr);
#if __SSE4_1__
                _val = _mm_cvtepi8_epi16(_val);
#else
                _val = _mm_unpacklo_epi8(_val, _mm_cmpgt_epi8(_mm_setzero_si128(), _val));
#endif

                __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                __m128i _w23 = _mm_loadu_si128((const __m128i*)(kptr0 + 16));
                __m128i _extw01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w01);
                __m128i _extw23 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w23);
                __m128i _w0 = _mm_unpacklo_epi8(_w01, _extw01);
                __m128i _w1 = _mm_unpackhi_epi8(_w01, _extw01);
                __m128i _w2 = _mm_unpacklo_epi8(_w23, _extw23);
                __m128i _w3 = _mm_unpackhi_epi8(_w23, _extw23);

#if __XOP__
                _sum0 = _mm_maddd_epi16(_val, _w0, _sum0);
                _sum1 = _mm_maddd_epi16(_val, _w1, _sum1);
                _sum2 = _mm_maddd_epi16(_val, _w2, _sum2);
                _sum3 = _mm_maddd_epi16(_val, _w3, _sum3);
#else
                __m128i _sl0 = _mm_mullo_epi16(_val, _w0);
                __m128i _sh0 = _mm_mulhi_epi16(_val, _w0);
                __m128i _sl1 = _mm_mullo_epi16(_val, _w1);
                __m128i _sh1 = _mm_mulhi_epi16(_val, _w1);
                __m128i _sl2 = _mm_mullo_epi16(_val, _w2);
                __m128i _sh2 = _mm_mulhi_epi16(_val, _w2);
                __m128i _sl3 = _mm_mullo_epi16(_val, _w3);
                __m128i _sh3 = _mm_mulhi_epi16(_val, _w3);

                _sum0 = _mm_add_epi32(_sum0, _mm_unpacklo_epi16(_sl0, _sh0));
                _sum1 = _mm_add_epi32(_sum1, _mm_unpacklo_epi16(_sl1, _sh1));
                _sum2 = _mm_add_epi32(_sum2, _mm_unpacklo_epi16(_sl2, _sh2));
                _sum3 = _mm_add_epi32(_sum3, _mm_unpacklo_epi16(_sl3, _sh3));
                _sum0 = _mm_add_epi32(_sum0, _mm_unpackhi_epi16(_sl0, _sh0));
                _sum1 = _mm_add_epi32(_sum1, _mm_unpackhi_epi16(_sl1, _sh1));
                _sum2 = _mm_add_epi32(_sum2, _mm_unpackhi_epi16(_sl2, _sh2));
                _sum3 = _mm_add_epi32(_sum3, _mm_unpackhi_epi16(_sl3, _sh3));
#endif
#endif

                tmpptr += 8;
                kptr0 += 32;
            }

#if __AVX2__
            __m128i _sum0 = _mm256_extracti128_si256(_sum0_1, 0);
            __m128i _sum1 = _mm256_extracti128_si256(_sum0_1, 1);
            __m128i _sum2 = _mm256_extracti128_si256(_sum2_3, 0);
            __m128i _sum3 = _mm256_extracti128_si256(_sum2_3, 1);
#endif

            // transpose 4x4
            {
                __m128i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm_unpacklo_epi32(_sum0, _sum1);
                _tmp1 = _mm_unpacklo_epi32(_sum2, _sum3);
                _tmp2 = _mm_unpackhi_epi32(_sum0, _sum1);
                _tmp3 = _mm_unpackhi_epi32(_sum2, _sum3);
                _sum0 = _mm_unpacklo_epi64(_tmp0, _tmp1);
                _sum1 = _mm_unpackhi_epi64(_tmp0, _tmp1);
                _sum2 = _mm_unpacklo_epi64(_tmp2, _tmp3);
                _sum3 = _mm_unpackhi_epi64(_tmp2, _tmp3);
            }

            _sum0 = _mm_add_epi32(_sum0, _sum1);
            _sum2 = _mm_add_epi32(_sum2, _sum3);

            _sum0 = _mm_add_epi32(_sum0, _sum2);

            _mm_storeu_si128((__m128i*)outptr0, _sum0);
            outptr0 += 4;
        }
    }
}